

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

void __thiscall
sf::priv::GlxContext::createSurface
          (GlxContext *this,GlxContext *shared,uint width,uint height,uint bitsPerPixel)

{
  Display *pDVar1;
  long lVar2;
  long lVar3;
  Window WVar4;
  GLXPbuffer GVar5;
  long lVar6;
  int nbConfigs;
  int minor;
  int major;
  XVisualInfo visualInfo;
  XSetWindowAttributes attributes;
  
  selectBestVisual(&visualInfo,this->m_display,bitsPerPixel,&(this->super_GlContext).m_settings);
  if ((shared != (GlxContext *)0x0) && (sfglx_ext_SGIX_pbuffer == 1)) {
    major = 0;
    glXQueryVersion(this->m_display,&major);
    if ((1 < major) &&
       (lVar2 = glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),0),
       lVar2 != 0)) {
      for (lVar6 = 0; lVar6 < 0; lVar6 = lVar6 + 1) {
        lVar3 = glXGetVisualFromFBConfig(this->m_display,*(undefined8 *)(lVar2 + lVar6 * 8));
        if (lVar3 != 0) {
          if (*(VisualID *)(lVar3 + 8) == visualInfo.visualid) {
            XFree(lVar3);
            attributes.background_pixmap._0_4_ = 0x8041;
            attributes.background_pixel._0_4_ = 0x8040;
            attributes.border_pixmap = 0;
            attributes.background_pixmap._4_4_ = width;
            attributes.background_pixel._4_4_ = height;
            GVar5 = glXCreatePbuffer(this->m_display,*(undefined8 *)(lVar2 + lVar6 * 8));
            this->m_pbuffer = GVar5;
            updateSettingsFromVisualInfo(this,&visualInfo);
            XFree(lVar2);
            return;
          }
          XFree(lVar3);
        }
      }
      XFree(lVar2);
    }
  }
  pDVar1 = this->m_display;
  lVar6 = (long)*(int *)(pDVar1 + 0xe0) * 0x80;
  attributes.colormap =
       XCreateColormap(pDVar1,*(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x10 + lVar6),
                       visualInfo.visual,0);
  lVar2 = *(long *)(this->m_display + 0xe8);
  WVar4 = XCreateWindow(this->m_display,*(undefined8 *)(lVar2 + 0x10 + lVar6),0,0,width,height,0,
                        *(undefined4 *)(lVar2 + 0x38 + lVar6),1,visualInfo.visual,0x2000,&attributes
                       );
  this->m_window = WVar4;
  this->m_ownsWindow = true;
  updateSettingsFromWindow(this);
  return;
}

Assistant:

void GlxContext::createSurface(GlxContext* shared, unsigned int width, unsigned int height, unsigned int bitsPerPixel)
{
    // Choose the visual according to the context settings
    XVisualInfo visualInfo = selectBestVisual(m_display, bitsPerPixel, m_settings);

    // Check if the shared context already exists and pbuffers are supported
    if (shared && (sfglx_ext_SGIX_pbuffer == sfglx_LOAD_SUCCEEDED))
    {
        // There are no GLX versions prior to 1.0
        int major = 0;
        int minor = 0;

        glXQueryVersion(m_display, &major, &minor);

        // Check if glXCreatePbuffer is available (requires GLX 1.3 or greater)
        bool hasCreatePbuffer = ((major > 1) || (minor >= 3));

        if (hasCreatePbuffer)
        {
            // Get a GLXFBConfig that matches the visual
            GLXFBConfig* config = NULL;

            // We don't supply attributes to match against, since
            // the visual we are matching against was already
            // deemed suitable in selectBestVisual()
            int nbConfigs = 0;
            GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

            for (int i = 0; configs && (i < nbConfigs); ++i)
            {
                XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

                if (!visual)
                    continue;

                if (visual->visualid == visualInfo.visualid)
                {
                    config = &configs[i];
                    XFree(visual);
                    break;
                }

                XFree(visual);
            }

            if (config)
            {
                int attributes[] =
                {
                    GLX_PBUFFER_WIDTH,  static_cast<int>(width),
                    GLX_PBUFFER_HEIGHT, static_cast<int>(height),
                    0,                  0
                };

                m_pbuffer = glXCreatePbuffer(m_display, *config, attributes);

                updateSettingsFromVisualInfo(&visualInfo);

                XFree(configs);

                return;
            }

            if (configs)
                XFree(configs);
        }
    }

    // If pbuffers are not available we use a hidden window as the off-screen surface to draw to
    int screen = DefaultScreen(m_display);

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, RootWindow(m_display, screen), visualInfo.visual, AllocNone);

    m_window = XCreateWindow(m_display,
                             RootWindow(m_display, screen),
                             0, 0,
                             width, height,
                             0,
                             DefaultDepth(m_display, screen),
                             InputOutput,
                             visualInfo.visual,
                             CWColormap,
                             &attributes);

    m_ownsWindow = true;

    updateSettingsFromWindow();
}